

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O3

void __thiscall
vector_block<unsigned_long,_1024U>::push_back
          (vector_block<unsigned_long,_1024U> *this,unsigned_long *t)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  uint uVar3;
  
  uVar3 = this->_left_in_block;
  if (uVar3 == 0) {
    vector_block<unsigned_long,1024u>::push_back();
    uVar3 = 0x400;
  }
  uVar1 = *t;
  puVar2 = this->_insertpos;
  this->_insertpos = puVar2 + 1;
  *puVar2 = uVar1;
  this->_left_in_block = uVar3 - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(is_full(), false)) {
			_insertpos = static_cast<T*>(malloc(B*sizeof(T)));
			_index_block.push_back(_insertpos);
			_left_in_block = B;
		}
		*_insertpos++ = t;
		--_left_in_block;
	}